

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::default_value_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  Type TVar4;
  uint32 uVar5;
  uint uVar6;
  Descriptor *this_00;
  protobuf *ppVar7;
  LogMessage *other;
  int i;
  uint i_00;
  uint i_01;
  int i_02;
  int i_03;
  long i_04;
  unsigned_long i_05;
  unsigned_long i_06;
  long i_07;
  long i_08;
  FieldGeneratorBase *this_01;
  float fVar8;
  float fVar9;
  double dVar10;
  double dVar11;
  allocator local_182;
  LogFinisher local_181;
  LogMessage local_180;
  string local_148;
  string local_128;
  allocator local_102;
  allocator local_101;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  allocator local_7f;
  allocator local_7e;
  allocator local_7d;
  float local_7c;
  undefined1 local_78 [4];
  float value_1;
  allocator local_53;
  allocator local_52;
  allocator local_51;
  double local_50;
  double value;
  FieldDescriptor *local_40;
  FieldDescriptor *wrapped_field;
  allocator local_21;
  FieldDescriptor *local_20;
  FieldDescriptor *descriptor_local;
  FieldGeneratorBase *this_local;
  
  this_01 = this;
  local_20 = descriptor;
  descriptor_local = (FieldDescriptor *)this;
  this_local = (FieldGeneratorBase *)__return_storage_ptr__;
  TVar4 = FieldDescriptor::type(descriptor);
  switch(TVar4) {
  case TYPE_DOUBLE:
    dVar10 = FieldDescriptor::default_value_double(local_20);
    local_50 = dVar10;
    dVar11 = std::numeric_limits<double>::infinity();
    dVar2 = local_50;
    if ((dVar10 != dVar11) || (NAN(dVar10) || NAN(dVar11))) {
      dVar10 = std::numeric_limits<double>::infinity();
      if ((dVar2 != -dVar10) || (NAN(dVar2) || NAN(-dVar10))) {
        bVar3 = MathLimits<double>::IsNaN(local_50);
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"double.NaN",&local_53);
          std::allocator<char>::~allocator((allocator<char> *)&local_53);
        }
        else {
          SimpleDtoa_abi_cxx11_((string *)local_78,(protobuf *)this_01,local_50);
          std::operator+(__return_storage_ptr__,(string *)local_78,"D");
          std::__cxx11::string::~string((string *)local_78);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"double.NegativeInfinity",&local_52);
        std::allocator<char>::~allocator((allocator<char> *)&local_52);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"double.PositiveInfinity",&local_51);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
    }
    break;
  case TYPE_FLOAT:
    fVar8 = FieldDescriptor::default_value_float(local_20);
    local_7c = fVar8;
    fVar9 = std::numeric_limits<float>::infinity();
    fVar1 = local_7c;
    if ((fVar8 != fVar9) || (NAN(fVar8) || NAN(fVar9))) {
      fVar8 = std::numeric_limits<float>::infinity();
      if ((fVar1 != -fVar8) || (NAN(fVar1) || NAN(-fVar8))) {
        bVar3 = MathLimits<float>::IsNaN(local_7c);
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"float.NaN",&local_7f);
          std::allocator<char>::~allocator((allocator<char> *)&local_7f);
        }
        else {
          SimpleFtoa_abi_cxx11_(&local_a0,(protobuf *)this_01,local_7c);
          std::operator+(__return_storage_ptr__,&local_a0,"F");
          std::__cxx11::string::~string((string *)&local_a0);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"float.NegativeInfinity",&local_7e);
        std::allocator<char>::~allocator((allocator<char> *)&local_7e);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"float.PositiveInfinity",&local_7d);
      std::allocator<char>::~allocator((allocator<char> *)&local_7d);
    }
    break;
  case TYPE_INT64:
    ppVar7 = (protobuf *)FieldDescriptor::default_value_int64(local_20);
    SimpleItoa_abi_cxx11_(&local_c0,ppVar7,i_04);
    std::operator+(__return_storage_ptr__,&local_c0,"L");
    std::__cxx11::string::~string((string *)&local_c0);
    break;
  case TYPE_UINT64:
    ppVar7 = (protobuf *)FieldDescriptor::default_value_uint64(local_20);
    SimpleItoa_abi_cxx11_(&local_e0,ppVar7,i_05);
    std::operator+(__return_storage_ptr__,&local_e0,"UL");
    std::__cxx11::string::~string((string *)&local_e0);
    break;
  case TYPE_INT32:
    uVar6 = FieldDescriptor::default_value_int32(local_20);
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar6,i);
    break;
  case TYPE_FIXED64:
    ppVar7 = (protobuf *)FieldDescriptor::default_value_uint64(local_20);
    SimpleItoa_abi_cxx11_(&local_100,ppVar7,i_06);
    std::operator+(__return_storage_ptr__,&local_100,"UL");
    std::__cxx11::string::~string((string *)&local_100);
    break;
  case TYPE_FIXED32:
    uVar5 = FieldDescriptor::default_value_uint32(local_20);
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar5,i_00);
    break;
  case TYPE_BOOL:
    bVar3 = FieldDescriptor::default_value_bool(local_20);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"true",&local_101);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"false",&local_102);
      std::allocator<char>::~allocator((allocator<char> *)&local_102);
    }
    break;
  case TYPE_STRING:
    GetStringDefaultValueInternal_abi_cxx11_(__return_storage_ptr__,this);
    break;
  case TYPE_GROUP:
  case TYPE_MESSAGE:
    bVar3 = IsWrapperType(local_20);
    if (bVar3) {
      this_00 = FieldDescriptor::message_type(local_20);
      local_40 = Descriptor::field(this_00,0);
      default_value_abi_cxx11_(__return_storage_ptr__,this,local_40);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"null",(allocator *)((long)&value + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&value + 7));
    }
    break;
  case TYPE_BYTES:
    GetBytesDefaultValueInternal_abi_cxx11_(__return_storage_ptr__,this);
    break;
  case TYPE_UINT32:
    uVar5 = FieldDescriptor::default_value_uint32(local_20);
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar5,i_01);
    break;
  case TYPE_ENUM:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"0",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case TYPE_SFIXED32:
    uVar6 = FieldDescriptor::default_value_int32(local_20);
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar6,i_02);
    break;
  case TYPE_SFIXED64:
    ppVar7 = (protobuf *)FieldDescriptor::default_value_int64(local_20);
    SimpleItoa_abi_cxx11_(&local_128,ppVar7,i_07);
    std::operator+(__return_storage_ptr__,&local_128,"L");
    std::__cxx11::string::~string((string *)&local_128);
    break;
  case TYPE_SINT32:
    uVar6 = FieldDescriptor::default_value_int32(local_20);
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar6,i_03);
    break;
  case MAX_TYPE:
    ppVar7 = (protobuf *)FieldDescriptor::default_value_int64(local_20);
    SimpleItoa_abi_cxx11_(&local_148,ppVar7,i_08);
    std::operator+(__return_storage_ptr__,&local_148,"L");
    std::__cxx11::string::~string((string *)&local_148);
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_180,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0x178);
    other = internal::LogMessage::operator<<(&local_180,"Unknown field type.");
    internal::LogFinisher::operator=(&local_181,other);
    internal::LogMessage::~LogMessage(&local_180);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_182);
    std::allocator<char>::~allocator((allocator<char> *)&local_182);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::default_value(const FieldDescriptor* descriptor) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_ENUM:
      // All proto3 enums have a default value of 0, and there's an implicit conversion from the constant 0 to
      // any C# enum. This means we don't need to work out what we actually mapped the enum value name to.
     return "0";
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      if (IsWrapperType(descriptor)) {
        const FieldDescriptor* wrapped_field = descriptor->message_type()->field(0);
        return default_value(wrapped_field);
      } else {
        return "null";
      }
    case FieldDescriptor::TYPE_DOUBLE: {
      double value = descriptor->default_value_double();
      if (value == numeric_limits<double>::infinity()) {
        return "double.PositiveInfinity";
      } else if (value == -numeric_limits<double>::infinity()) {
        return "double.NegativeInfinity";
      } else if (MathLimits<double>::IsNaN(value)) {
        return "double.NaN";
      }
      return SimpleDtoa(value) + "D";
    }
    case FieldDescriptor::TYPE_FLOAT: {
      float value = descriptor->default_value_float();
      if (value == numeric_limits<float>::infinity()) {
        return "float.PositiveInfinity";
      } else if (value == -numeric_limits<float>::infinity()) {
        return "float.NegativeInfinity";
      } else if (MathLimits<float>::IsNaN(value)) {
        return "float.NaN";
      }
      return SimpleFtoa(value) + "F";
    }
    case FieldDescriptor::TYPE_INT64:
      return SimpleItoa(descriptor->default_value_int64()) + "L";
    case FieldDescriptor::TYPE_UINT64:
      return SimpleItoa(descriptor->default_value_uint64()) + "UL";
    case FieldDescriptor::TYPE_INT32:
      return SimpleItoa(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_FIXED64:
      return SimpleItoa(descriptor->default_value_uint64()) + "UL";
    case FieldDescriptor::TYPE_FIXED32:
      return SimpleItoa(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_BOOL:
      if (descriptor->default_value_bool()) {
        return "true";
      } else {
        return "false";
      }
    case FieldDescriptor::TYPE_STRING:
      return GetStringDefaultValueInternal();
    case FieldDescriptor::TYPE_BYTES:
      return GetBytesDefaultValueInternal();
    case FieldDescriptor::TYPE_UINT32:
      return SimpleItoa(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_SFIXED32:
      return SimpleItoa(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SFIXED64:
      return SimpleItoa(descriptor->default_value_int64()) + "L";
    case FieldDescriptor::TYPE_SINT32:
      return SimpleItoa(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SINT64:
      return SimpleItoa(descriptor->default_value_int64()) + "L";
    default:
      GOOGLE_LOG(FATAL)<< "Unknown field type.";
      return "";
  }
}